

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O3

void __thiscall QPDFObjectHandle::replaceDict(QPDFObjectHandle *this,QPDFObjectHandle *new_dict)

{
  element_type *__v;
  __index_type _Var1;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar2;
  Stream local_28;
  
  __v = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  if (__v != (element_type *)0x0) {
    _Var1 = (__v->value).
            super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ._M_index;
    if (_Var1 == '\x0f') {
      pvVar2 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&__v->value);
LAB_001ffa20:
      _Var1 = *(__index_type *)
               ((long)&(((pvVar2->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 0x30);
    }
    else if (_Var1 == '\r') {
      pvVar2 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)QPDF::resolve(__v->qpdf,*(QPDFObjGen *)&(__v->og).obj);
      goto LAB_001ffa20;
    }
    if (_Var1 == '\n') {
      local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_28.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_28.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      goto LAB_001ffa68;
    }
  }
  assertType(this,"stream",false);
  local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001ffa68:
  ::qpdf::Stream::replaceDict(&local_28,new_dict);
  if (local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::replaceDict(QPDFObjectHandle const& new_dict)
{
    as_stream(error).replaceDict(new_dict);
}